

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

int uudecode_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  ssize_t sVar4;
  long lVar5;
  byte *pbVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ssize_t avail;
  byte *local_50;
  size_t nbytes_read;
  ssize_t nl;
  ssize_t ravail;
  
  local_50 = (byte *)__archive_read_filter_ahead(filter,1,&avail);
  if (local_50 == (byte *)0x0) {
    return 0;
  }
  ravail = avail;
  nbytes_read = avail;
  uVar9 = 0x14;
  do {
    sVar4 = bid_get_line(filter,&local_50,&avail,&ravail,&nl,&nbytes_read);
    pbVar6 = local_50;
    if (sVar4 < 0) {
      return 0;
    }
    if (nl == 0) {
      return 0;
    }
    uVar8 = sVar4 - nl;
    if ((long)uVar8 < 0xb) {
LAB_0051aa23:
      iVar3 = 0;
    }
    else {
      iVar3 = bcmp(local_50,"begin ",6);
      lVar5 = 6;
      if (iVar3 != 0) {
        if (0x11 < uVar8) {
          iVar3 = bcmp(pbVar6,"begin-base64 ",0xd);
          lVar5 = 0xd;
          if (iVar3 == 0) goto LAB_0051a9f5;
        }
        goto LAB_0051aa23;
      }
LAB_0051a9f5:
      iVar3 = (int)lVar5;
      if (((((byte)(pbVar6[lVar5] - 0x38) < 0xf8) || ((byte)(pbVar6[lVar5 + 1] - 0x38) < 0xf8)) ||
          ((byte)(pbVar6[lVar5 + 2] - 0x38) < 0xf8)) || (pbVar6[lVar5 + 3] != 0x20))
      goto LAB_0051aa23;
    }
    local_50 = pbVar6 + sVar4;
    if (iVar3 != 0) {
      if (avail == sVar4) {
        return 0;
      }
      avail = avail - sVar4;
      lVar5 = bid_get_line(filter,&local_50,&avail,&ravail,&nl,&nbytes_read);
      if (nl == 0 || lVar5 < 0) {
        return 0;
      }
      lVar7 = avail - lVar5;
      if (iVar3 == 6) {
        if (""[*local_50] == '\0') {
          return 0;
        }
        uVar8 = (ulong)(*local_50 & 0x3f) ^ 0x20;
        if (0x2d < (byte)uVar8) {
          return 0;
        }
        if (~nl + lVar5 < (long)uVar8) {
          return 0;
        }
        pbVar6 = local_50 + uVar8 + 1;
        for (lVar7 = 0; (int)uVar8 != (int)lVar7; lVar7 = lVar7 + 1) {
          if (""[local_50[lVar7 + 1]] == '\0') {
            return 0;
          }
        }
        if ((lVar5 - nl) + -2 == lVar7) {
          pbVar6 = pbVar6 + ((byte)(*pbVar6 + 0x9f) < 0x1a || ""[*pbVar6] != '\0');
        }
        if (avail == lVar5) {
          return 0;
        }
        uVar2 = ""[pbVar6[nl]];
      }
      else {
        pbVar6 = local_50;
        if (iVar3 != 0xd) {
          return 0;
        }
        while (nl < lVar5) {
          bVar1 = *pbVar6;
          lVar5 = lVar5 + -1;
          pbVar6 = pbVar6 + 1;
          if (""[bVar1] == '\0') {
            return 0;
          }
        }
        pbVar6 = pbVar6 + nl;
        if (lVar7 < 5) {
          if (lVar7 < 1) {
            return 0;
          }
        }
        else {
          avail = lVar7;
          iVar3 = bcmp(pbVar6,"====\n",5);
          if ((iVar3 == 0) || ((lVar7 != 5 && (iVar3 = bcmp(pbVar6,"====\r\n",6), iVar3 == 0)))) {
            return uVar9 | 0x28;
          }
        }
        uVar2 = ""[*pbVar6];
      }
      if (uVar2 != '\0') {
        return uVar9 + 0x1e;
      }
      return 0;
    }
    uVar9 = 0;
    avail = avail - sVar4;
    if (0x1ffff < nbytes_read) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
uudecode_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int l;
	int firstline;
	size_t nbytes_read;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 1, &avail);
	if (b == NULL)
		return (0);

	firstline = 20;
	ravail = avail;
	nbytes_read = avail;
	for (;;) {
		len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
		if (len < 0 || nl == 0)
			return (0); /* No match found. */
		if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
			l = 6;
		else if (len -nl >= 18 && memcmp(b, "begin-base64 ", 13) == 0)
			l = 13;
		else
			l = 0;

		if (l > 0 && (b[l] < '0' || b[l] > '7' ||
		    b[l+1] < '0' || b[l+1] > '7' ||
		    b[l+2] < '0' || b[l+2] > '7' || b[l+3] != ' '))
			l = 0;

		b += len;
		avail -= len;
		if (l)
			break;
		firstline = 0;

		/* Do not read more than UUENCODE_BID_MAX_READ bytes */
		if (nbytes_read >= UUENCODE_BID_MAX_READ)
			return (0);
	}
	if (!avail)
		return (0);
	len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
	if (len < 0 || nl == 0)
		return (0);/* There are non-ascii characters. */
	avail -= len;

	if (l == 6) {
		/* "begin " */
		if (!uuchar[*b])
			return (0);
		/* Get a length of decoded bytes. */
		l = UUDECODE(*b++); len--;
		if (l > 45)
			/* Normally, maximum length is 45(character 'M'). */
			return (0);
		if (l > len - nl)
			return (0); /* Line too short. */
		while (l) {
			if (!uuchar[*b++])
				return (0);
			--len;
			--l;
		}
		if (len-nl == 1 &&
		    (uuchar[*b] ||		 /* Check sum. */
		     (*b >= 'a' && *b <= 'z'))) {/* Padding data(MINIX). */
			++b;
			--len;
		}
		b += nl;
		if (avail && uuchar[*b])
			return (firstline+30);
	} else if (l == 13) {
		/* "begin-base64 " */
		while (len-nl > 0) {
			if (!base64[*b++])
				return (0);
			--len;
		}
		b += nl;

		if (avail >= 5 && memcmp(b, "====\n", 5) == 0)
			return (firstline+40);
		if (avail >= 6 && memcmp(b, "====\r\n", 6) == 0)
			return (firstline+40);
		if (avail > 0 && base64[*b])
			return (firstline+30);
	}

	return (0);
}